

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qualified_name.cpp
# Opt level: O1

void __thiscall
duckdb::QualifiedColumnName::QualifiedColumnName
          (QualifiedColumnName *this,BindingAlias *alias,string *column_p)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  pointer pcVar3;
  undefined8 uVar4;
  string *psVar5;
  
  (this->catalog)._M_dataplus._M_p = (pointer)&(this->catalog).field_2;
  pcVar3 = (alias->catalog)._M_dataplus._M_p;
  ::std::__cxx11::string::_M_construct<char*>
            ((string *)this,pcVar3,pcVar3 + (alias->catalog)._M_string_length);
  (this->schema)._M_dataplus._M_p = (pointer)&(this->schema).field_2;
  pcVar3 = (alias->schema)._M_dataplus._M_p;
  ::std::__cxx11::string::_M_construct<char*>
            ((string *)&this->schema,pcVar3,pcVar3 + (alias->schema)._M_string_length);
  psVar5 = BindingAlias::GetAlias_abi_cxx11_(alias);
  (this->table)._M_dataplus._M_p = (pointer)&(this->table).field_2;
  pcVar3 = (psVar5->_M_dataplus)._M_p;
  ::std::__cxx11::string::_M_construct<char*>
            ((string *)&this->table,pcVar3,pcVar3 + psVar5->_M_string_length);
  paVar1 = &(this->column).field_2;
  (this->column)._M_dataplus._M_p = (pointer)paVar1;
  pcVar3 = (column_p->_M_dataplus)._M_p;
  paVar2 = &column_p->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar3 == paVar2) {
    uVar4 = *(undefined8 *)((long)&column_p->field_2 + 8);
    paVar1->_M_allocated_capacity = paVar2->_M_allocated_capacity;
    *(undefined8 *)((long)&(this->column).field_2 + 8) = uVar4;
  }
  else {
    (this->column)._M_dataplus._M_p = pcVar3;
    (this->column).field_2._M_allocated_capacity = paVar2->_M_allocated_capacity;
  }
  (this->column)._M_string_length = column_p->_M_string_length;
  (column_p->_M_dataplus)._M_p = (pointer)paVar2;
  column_p->_M_string_length = 0;
  (column_p->field_2)._M_local_buf[0] = '\0';
  return;
}

Assistant:

QualifiedColumnName::QualifiedColumnName(const BindingAlias &alias, string column_p)
    : catalog(alias.GetCatalog()), schema(alias.GetSchema()), table(alias.GetAlias()), column(std::move(column_p)) {
}